

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_3(QPDF *pdf,char *arg2)

{
  int iVar1;
  ostream *poVar2;
  element_type *peVar3;
  undefined1 local_90 [8];
  shared_ptr<Pl_StdioFile> out;
  QPDFObjectHandle stream;
  int i;
  allocator<char> local_59;
  string local_58 [32];
  QPDFObjectHandle local_38;
  undefined1 local_28 [8];
  QPDFObjectHandle streams;
  char *arg2_local;
  QPDF *pdf_local;
  
  streams.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/QStreams",&local_59);
  QPDFObjectHandle::getKey((string *)local_28);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi._0_4_ = 0;
  while( true ) {
    iVar1 = QPDFObjectHandle::getArrayNItems();
    if (iVar1 <= (int)stream.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    break;
    QPDFObjectHandle::getArrayItem((int)&out + 8);
    poVar2 = std::operator<<((ostream *)&std::cout,"-- stream ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,(int)stream.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi);
    poVar2 = std::operator<<(poVar2," --");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
    QUtil::binary_stdout();
    std::make_shared<Pl_StdioFile,char_const(&)[17],_IO_FILE*&>
              ((char (*) [17])local_90,(_IO_FILE **)"tokenized stream");
    peVar3 = std::__shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2> *)local_90);
    QPDFObjectHandle::pipeStreamData
              ((Pipeline *)
               &out.super___shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (int)peVar3,qpdf_dl_specialized,true,false);
    std::shared_ptr<Pl_StdioFile>::~shared_ptr((shared_ptr<Pl_StdioFile> *)local_90);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &out.super___shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ =
         (int)stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi + 1;
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  return;
}

Assistant:

static void
test_3(QPDF& pdf, char const* arg2)
{
    QPDFObjectHandle streams = pdf.getTrailer().getKey("/QStreams");
    for (int i = 0; i < streams.getArrayNItems(); ++i) {
        QPDFObjectHandle stream = streams.getArrayItem(i);
        std::cout << "-- stream " << i << " --" << std::endl;
        std::cout.flush();
        QUtil::binary_stdout();
        auto out = std::make_shared<Pl_StdioFile>("tokenized stream", stdout);
        stream.pipeStreamData(out.get(), qpdf_ef_normalize, qpdf_dl_generalized);
    }
}